

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

Instr * __thiscall LowererMDArch::LoadStackArgPtr(LowererMDArch *this,Instr *instrArgPtr)

{
  Opnd *this_00;
  RegOpnd *optionalDstOpnd;
  Instr *pIVar1;
  Instr *instr;
  Instr *instrArgPtr_local;
  LowererMDArch *this_local;
  
  this_00 = IR::Instr::UnlinkDst(instrArgPtr);
  optionalDstOpnd = IR::Opnd::AsRegOpnd(this_00);
  pIVar1 = LoadInputParamPtr(this,instrArgPtr,optionalDstOpnd);
  IR::Instr::Remove(instrArgPtr);
  return pIVar1->m_prev;
}

Assistant:

IR::Instr *
LowererMDArch::LoadStackArgPtr(IR::Instr * instrArgPtr)
{
    // Get the args pointer relative to the frame pointer.
    // NOTE: This code is sufficient for the apply-args optimization, but not for StackArguments,
    // if and when that is enabled.

    // dst = LEA &[rbp + "this" offset + sizeof(var)]

    IR::Instr * instr = LoadInputParamPtr(instrArgPtr, instrArgPtr->UnlinkDst()->AsRegOpnd());
    instrArgPtr->Remove();

    return instr->m_prev;
}